

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.hpp
# Opt level: O0

void __thiscall
BSP<int>::runAndWait
          (BSP<int> *this,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *input,vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *output,bool setAffinity)

{
  bool bVar1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *a;
  size_type sVar2;
  runtime_error *this_00;
  iterator iVar3;
  iterator iVar4;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_RDX;
  vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_> *in_RDI;
  UTimer timer;
  vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_> lockableVectors;
  int nextStep;
  int retVal;
  vector<WorkerThread,_std::allocator<WorkerThread>_> *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  ostream *in_stack_fffffffffffffee8;
  UTimer *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  int iVar5;
  undefined4 in_stack_fffffffffffffefc;
  BSP<int> *this_01;
  undefined8 in_stack_ffffffffffffff28;
  string local_d0 [32];
  string local_b0 [32];
  UTimer *in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff7f;
  BSP<int> *in_stack_ffffffffffffff80;
  vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_> *in_stack_ffffffffffffffa8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_ffffffffffffffb0;
  vector<WorkerThread,_std::allocator<WorkerThread>_> *in_stack_ffffffffffffffb8;
  Superstep<int> *in_stack_ffffffffffffffc0;
  int local_24;
  int local_20;
  
  local_20 = 0;
  local_24 = 0;
  a = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       *)std::
         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ::size(in_RDX);
  this_01 = (BSP<int> *)&stack0xffffffffffffffbf;
  std::allocator<LockableVector<int>_>::allocator((allocator<LockableVector<int>_> *)0x109761);
  std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>::vector
            (in_RDI,CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
             (allocator_type *)in_stack_fffffffffffffef0);
  std::allocator<LockableVector<int>_>::~allocator((allocator<LockableVector<int>_> *)0x109787);
  setupWorkers(in_stack_ffffffffffffff80,(bool)in_stack_ffffffffffffff7f);
  swapVectors(this_01,a,in_RDI);
  while( true ) {
    bVar1 = false;
    if (local_20 !=
        *(int *)((long)&in_RDI[2].
                        super__Vector_base<LockableVector<int>,_std::allocator<LockableVector<int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 4)) {
      iVar5 = local_24;
      sVar2 = std::
              vector<std::shared_ptr<Superstep<int>_>,_std::allocator<std::shared_ptr<Superstep<int>_>_>_>
              ::size((vector<std::shared_ptr<Superstep<int>_>,_std::allocator<std::shared_ptr<Superstep<int>_>_>_>
                      *)(in_RDI + 1));
      bVar1 = iVar5 < (int)sVar2;
    }
    if (!bVar1) break;
    std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    std::operator+((char *)in_stack_fffffffffffffee8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    UTimer::UTimer(in_stack_fffffffffffffef0,(string *)in_stack_fffffffffffffee8);
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::~string(local_d0);
    in_stack_fffffffffffffef0 =
         (UTimer *)std::operator<<((ostream *)&std::cout,"\n\nRunning superstep  ");
    in_stack_fffffffffffffee8 =
         (ostream *)std::ostream::operator<<((ostream *)in_stack_fffffffffffffef0,local_24);
    std::ostream::operator<<(in_stack_fffffffffffffee8,std::endl<char,std::char_traits<char>>);
    std::
    vector<std::shared_ptr<Superstep<int>_>,_std::allocator<std::shared_ptr<Superstep<int>_>_>_>::
    operator[]((vector<std::shared_ptr<Superstep<int>_>,_std::allocator<std::shared_ptr<Superstep<int>_>_>_>
                *)(in_RDI + 1),(long)local_24);
    std::__shared_ptr_access<Superstep<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Superstep<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1098bf);
    local_20 = Superstep<int>::runStep
                         (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                          in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (local_20 ==
        *(int *)&in_RDI[2].
                 super__Vector_base<LockableVector<int>,_std::allocator<LockableVector<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start) {
      local_24 = local_24 + 1;
    }
    else if ((local_20 !=
              *(int *)((long)&in_RDI[2].
                              super__Vector_base<LockableVector<int>,_std::allocator<LockableVector<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 4)) &&
            (local_24 = local_20, local_20 < 0)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"Wrong number of superstep returned by \'atExit\' function");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    in_stack_fffffffffffffee4 = local_20;
    swapVectors(this_01,a,in_RDI);
    UTimer::~UTimer(in_stack_ffffffffffffff70);
  }
  std::
  swap<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
            ((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)in_stack_fffffffffffffed8);
  iVar3 = std::vector<WorkerThread,_std::allocator<WorkerThread>_>::begin(in_stack_fffffffffffffed8)
  ;
  iVar4 = std::vector<WorkerThread,_std::allocator<WorkerThread>_>::end(in_stack_fffffffffffffed8);
  std::
  for_each<__gnu_cxx::__normal_iterator<WorkerThread*,std::vector<WorkerThread,std::allocator<WorkerThread>>>,BSP<int>::runAndWait(std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>&,bool)::_lambda(WorkerThread&)_1_>
            (iVar3._M_current,iVar4._M_current);
  std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>::~vector
            ((vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_> *)
             in_stack_fffffffffffffef0);
  return;
}

Assistant:

void BSP<T>::runAndWait (std::vector<std::vector<T>> &input, std::vector<std::vector<T>> &output, bool setAffinity) {
	int retVal		= 0;
	int nextStep	= 0;
	std::vector<LockableVector<T>> lockableVectors (output.size());

	setupWorkers (setAffinity);

	swapVectors (output, lockableVectors);
	

	while (retVal != EOC_FLAG && nextStep < (int) supersteps.size()) {

		{
			UTimer timer ("Superstep " + std::to_string (nextStep));
			std::cout << "\n\nRunning superstep  " << nextStep << std::endl;

			retVal	= supersteps[nextStep]->runStep (workers, input, lockableVectors);

			// Swapping vectors
			if (retVal == NEXT_STEP_FLAG) {
				nextStep++;
			}
			else if (retVal == EOC_FLAG) {
				// Do nothing
			}
			else if (retVal>=0) {
				nextStep	= retVal;
			}
			else
				throw std::runtime_error ("Wrong number of superstep returned by 'atExit' function");

			swapVectors (input, lockableVectors);
		}
	}

	
	std::swap (output, input);

	std::for_each (workers.begin(), workers.end(), [] (WorkerThread &w) {
		w.stopWorker ();
	});
}